

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderGetAttributeNs
                    (xmlTextReaderPtr reader,xmlChar *localName,xmlChar *namespaceURI)

{
  int iVar1;
  xmlChar *pxVar2;
  undefined8 *puStack_40;
  int result;
  xmlNsPtr ns;
  xmlChar *prefix;
  xmlChar *ret;
  xmlChar *namespaceURI_local;
  xmlChar *localName_local;
  xmlTextReaderPtr reader_local;
  
  prefix = (xmlChar *)0x0;
  ns = (xmlNsPtr)0x0;
  if ((reader == (xmlTextReaderPtr)0x0) || (localName == (xmlChar *)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->curnode == (xmlNodePtr)0x0) {
    if (reader->node->type == XML_ELEMENT_NODE) {
      ret = namespaceURI;
      namespaceURI_local = localName;
      localName_local = (xmlChar *)reader;
      iVar1 = xmlStrEqual(namespaceURI,(xmlChar *)"http://www.w3.org/2000/xmlns/");
      if (iVar1 == 0) {
        iVar1 = xmlNodeGetAttrValue(*(xmlNode **)(localName_local + 0x70),namespaceURI_local,ret,
                                    &prefix);
        if (iVar1 < 0) {
          xmlTextReaderErrMemory((xmlTextReaderPtr)localName_local);
        }
        reader_local = (xmlTextReaderPtr)prefix;
      }
      else {
        iVar1 = xmlStrEqual(namespaceURI_local,"xmlns");
        if (iVar1 == 0) {
          ns = (xmlNsPtr)namespaceURI_local;
        }
        for (puStack_40 = *(undefined8 **)(*(long *)(localName_local + 0x70) + 0x60);
            puStack_40 != (undefined8 *)0x0; puStack_40 = (undefined8 *)*puStack_40) {
          if (((ns == (xmlNsPtr)0x0) && (puStack_40[3] == 0)) ||
             ((puStack_40[3] != 0 &&
              (iVar1 = xmlStrEqual((xmlChar *)puStack_40[3],namespaceURI_local), iVar1 != 0)))) {
            pxVar2 = readerStrdup((xmlTextReaderPtr)localName_local,(xmlChar *)puStack_40[2]);
            return pxVar2;
          }
        }
        reader_local = (xmlTextReaderPtr)0x0;
      }
    }
    else {
      reader_local = (xmlTextReaderPtr)0x0;
    }
  }
  else {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderGetAttributeNs(xmlTextReaderPtr reader, const xmlChar *localName,
			    const xmlChar *namespaceURI) {
    xmlChar *ret = NULL;
    xmlChar *prefix = NULL;
    xmlNsPtr ns;
    int result;

    if ((reader == NULL) || (localName == NULL))
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	return(NULL);

    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(NULL);

    if (xmlStrEqual(namespaceURI, BAD_CAST "http://www.w3.org/2000/xmlns/")) {
        if (! xmlStrEqual(localName, BAD_CAST "xmlns")) {
            prefix = BAD_CAST localName;
        }
        ns = reader->node->nsDef;
        while (ns != NULL) {
            if ((prefix == NULL && ns->prefix == NULL) ||
                ((ns->prefix != NULL) && (xmlStrEqual(ns->prefix, localName)))) {
                return readerStrdup(reader, ns->href);
            }
            ns = ns->next;
        }
        return NULL;
    }

    result = xmlNodeGetAttrValue(reader->node, localName, namespaceURI, &ret);
    if (result < 0)
        xmlTextReaderErrMemory(reader);

    return(ret);
}